

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.h
# Opt level: O2

bool __thiscall wasm::Type::isExn(Type *this)

{
  bool bVar1;
  HeapType local_10;
  
  if ((this->id & 1) == 0 && 6 < this->id) {
    local_10 = getHeapType(this);
    bVar1 = HeapType::isExn(&local_10);
    return bVar1;
  }
  return false;
}

Assistant:

constexpr bool isBasic() const { return id <= _last_basic_type; }